

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O0

MPP_RET vdpp2_params_to_reg(vdpp2_params *src_params,vdpp2_api_ctx *ctx)

{
  vdpp2_reg *dst_reg_00;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  RK_U32 dst_right_redundant_c;
  RK_U32 dst_right_redundant;
  RK_U32 src_down_redundant;
  RK_U32 src_right_redundant;
  zme_params *zme_params;
  vdpp2_reg *dst_reg;
  vdpp2_api_ctx *ctx_local;
  vdpp2_params *src_params_local;
  
  dst_reg_00 = &ctx->reg;
  memset(dst_reg_00,0,0x440);
  *(byte *)&(dst_reg_00->common).reg0 = *(byte *)&(dst_reg_00->common).reg0 & 0xfe | 1;
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)((uint)(ctx->reg).common.reg1 & 0xfffffffc | 3);
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)
       ((uint)(ctx->reg).common.reg1 & 0xffffffcf | (src_params->src_yuv_swap & 3) << 4);
  if (src_params->src_fmt == 5) {
    (ctx->reg).common.reg1 =
         (anon_struct_4_17_f45c7487_for_reg1)((uint)(ctx->reg).common.reg1 & 0xffffffcf | 0x10);
  }
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)
       ((uint)(ctx->reg).common.reg1 & 0xfffffcff | (src_params->dst_fmt & 3) << 8);
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)
       ((uint)(ctx->reg).common.reg1 & 0xffffcfff | (src_params->dst_yuv_swap & 3) << 0xc);
  if (src_params->working_mode == 3) {
    local_3c = 0;
  }
  else {
    local_3c = (uint)((src_params->dmsr_params).dmsr_enable & 1);
  }
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)
       ((uint)(ctx->reg).common.reg1 & 0xfeffffff | local_3c << 0x18);
  *(byte *)&(ctx->reg).common.reg2 =
       *(byte *)&(ctx->reg).common.reg2 & 0xfc | (byte)src_params->working_mode & 3;
  if ((vdpp2_debug & 1) != 0) {
    _mpp_log_l(4,"vdpp2","working_mode %d",0,src_params->working_mode);
  }
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xfffe | 1;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xfffd | 2;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xfffb | 4;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xfff7 | 8;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xffef | 0x10;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xffdf | 0x20;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xffbf | 0x40;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xff7f | 0x80;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xfeff | 0x100;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xfdff | 0x200;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xfbff | 0x400;
  *(ushort *)&(ctx->reg).common.reg4 = *(ushort *)&(ctx->reg).common.reg4 & 0xf7ff | 0x800;
  *(byte *)&(ctx->reg).common.reg8 = *(byte *)&(ctx->reg).common.reg8 & 0xfe | 1;
  *(byte *)&(ctx->reg).common.reg8 = *(byte *)&(ctx->reg).common.reg8 & 0xfd | 2;
  *(byte *)&(ctx->reg).common.reg8 = *(byte *)&(ctx->reg).common.reg8 & 0xef | 0x10;
  *(byte *)&(ctx->reg).common.reg8 = *(byte *)&(ctx->reg).common.reg8 & 0xdf | 0x20;
  *(byte *)&(ctx->reg).common.reg8 = *(byte *)&(ctx->reg).common.reg8 & 0xbf | 0x40;
  if ((src_params->src_width & 0xf) == 0) {
    local_40 = 0;
  }
  else {
    local_40 = 0x10 - (src_params->src_width & 0xf);
  }
  if ((src_params->src_height & 7) == 0) {
    local_44 = 0;
  }
  else {
    local_44 = 8 - (src_params->src_height & 7);
  }
  if ((src_params->dst_width & 0xf) == 0) {
    local_48 = 0;
  }
  else {
    local_48 = 0x10 - (src_params->dst_width & 0xf);
  }
  *(short *)&(ctx->reg).common.reg12 = (short)(src_params->src_width_vir >> 2);
  (ctx->reg).common.reg13 =
       (anon_struct_4_2_b89f876b_for_reg13)
       ((uint)(ctx->reg).common.reg13 & 0xffff0000 | src_params->dst_width_vir >> 2 & 0xffff);
  (ctx->reg).common.reg14 =
       (anon_struct_4_6_2c2caa47_for_reg14)
       ((uint)(ctx->reg).common.reg14 & 0xfffff800 | (src_params->src_width + local_40) - 1 & 0x7ff)
  ;
  (ctx->reg).common.reg14 =
       (anon_struct_4_6_2c2caa47_for_reg14)
       ((uint)(ctx->reg).common.reg14 & 0xffff0fff | (local_40 & 0xf) << 0xc);
  (ctx->reg).common.reg14 =
       (anon_struct_4_6_2c2caa47_for_reg14)
       ((uint)(ctx->reg).common.reg14 & 0xf800ffff |
       ((src_params->src_height + local_44) - 1 & 0x7ff) << 0x10);
  (ctx->reg).common.reg14 =
       (anon_struct_4_6_2c2caa47_for_reg14)
       ((uint)(ctx->reg).common.reg14 & 0x8fffffff | (local_44 & 7) << 0x1c);
  (ctx->reg).common.reg15 =
       (anon_struct_4_4_4045accf_for_reg15)
       ((uint)(ctx->reg).common.reg15 & 0xfffff800 | (src_params->dst_width + local_48) - 1 & 0x7ff)
  ;
  (ctx->reg).common.reg15 =
       (anon_struct_4_4_4045accf_for_reg15)
       ((uint)(ctx->reg).common.reg15 & 0xffff0fff | (local_48 & 0xf) << 0xc);
  (ctx->reg).common.reg15 =
       (anon_struct_4_4_4045accf_for_reg15)
       ((uint)(ctx->reg).common.reg15 & 0xf800ffff | (src_params->dst_height - 1 & 0x7ff) << 0x10);
  (ctx->reg).common.reg20 =
       (anon_struct_4_2_3349d787_for_reg20)((uint)(ctx->reg).common.reg20 & 0x7fffffff | 0x80000000)
  ;
  (ctx->reg).common.reg20 =
       (anon_struct_4_2_3349d787_for_reg20)((uint)(ctx->reg).common.reg20 & 0x80000000 | 0x8ffffff);
  (ctx->reg).common.reg24 = (anon_struct_4_1_9b21a0fa_for_reg24)(src_params->src).y;
  (ctx->reg).common.reg25 = (anon_struct_4_1_c9127a9e_for_reg25)(src_params->src).cbcr;
  (ctx->reg).common.reg26 = (anon_struct_4_1_c50c69f9_for_reg26)(src_params->dst).y;
  (ctx->reg).common.reg27 = (anon_struct_4_1_dc80d17f_for_reg27)(src_params->dst).cbcr;
  if (src_params->yuv_out_diff != 0) {
    if ((src_params->dst_c_width & 0xf) == 0) {
      local_4c = 0;
    }
    else {
      local_4c = 0x10 - (src_params->dst_c_width & 0xf);
    }
    (ctx->reg).common.reg1 =
         (anon_struct_4_17_f45c7487_for_reg1)
         ((uint)(ctx->reg).common.reg1 & 0xfffffbff | (src_params->yuv_out_diff & 1) << 10);
    (ctx->reg).common.reg13 =
         (anon_struct_4_2_b89f876b_for_reg13)
         ((uint)(ctx->reg).common.reg13 & 0xffff | (src_params->dst_c_width_vir >> 2) << 0x10);
    (ctx->reg).common.reg16 =
         (anon_struct_4_4_effd29bf_for_reg16)
         ((uint)(ctx->reg).common.reg16 & 0xfffff800 |
         (src_params->dst_c_width + local_4c) - 1 & 0x7ff);
    (ctx->reg).common.reg16 =
         (anon_struct_4_4_effd29bf_for_reg16)
         ((uint)(ctx->reg).common.reg16 & 0xffff0fff | (local_4c & 0xf) << 0xc);
    (ctx->reg).common.reg16 =
         (anon_struct_4_4_effd29bf_for_reg16)
         ((uint)(ctx->reg).common.reg16 & 0xf800ffff |
         (src_params->dst_c_height - 1 & 0x7ff) << 0x10);
    (ctx->reg).common.reg27 = (anon_struct_4_1_dc80d17f_for_reg27)(src_params->dst_c).cbcr;
  }
  set_dmsr_to_vdpp_reg(&src_params->dmsr_params,&ctx->dmsr);
  set_hist_to_vdpp2_reg(src_params,dst_reg_00);
  set_es_to_vdpp2_reg(src_params,dst_reg_00);
  set_shp_to_vdpp2_reg(src_params,dst_reg_00);
  (src_params->zme_params).src_width = src_params->src_width;
  (src_params->zme_params).src_height = src_params->src_height;
  (src_params->zme_params).dst_width = src_params->dst_width;
  (src_params->zme_params).dst_height = src_params->dst_height;
  (src_params->zme_params).dst_fmt = src_params->dst_fmt;
  (src_params->zme_params).yuv_out_diff = src_params->yuv_out_diff;
  (src_params->zme_params).dst_c_width = src_params->dst_c_width;
  (src_params->zme_params).dst_c_height = src_params->dst_c_height;
  set_zme_to_vdpp_reg(&src_params->zme_params,&ctx->zme);
  return MPP_OK;
}

Assistant:

static MPP_RET vdpp2_params_to_reg(struct vdpp2_params* src_params, struct vdpp2_api_ctx *ctx)
{
    struct vdpp2_reg *dst_reg = &ctx->reg;
    struct zme_params *zme_params = &src_params->zme_params;

    memset(dst_reg, 0, sizeof(*dst_reg));

    dst_reg->common.reg0.sw_vdpp_frm_en = 1;

    /* 0x0004(reg1), TODO: add debug function */
    dst_reg->common.reg1.sw_vdpp_src_fmt = VDPP_FMT_YUV420;
    dst_reg->common.reg1.sw_vdpp_src_yuv_swap = src_params->src_yuv_swap;

    if (MPP_FMT_YUV420SP_VU == src_params->src_fmt)
        dst_reg->common.reg1.sw_vdpp_src_yuv_swap = 1;

    dst_reg->common.reg1.sw_vdpp_dst_fmt = src_params->dst_fmt;
    dst_reg->common.reg1.sw_vdpp_dst_yuv_swap = src_params->dst_yuv_swap;
    dst_reg->common.reg1.sw_vdpp_dbmsr_en = (src_params->working_mode == VDPP_WORK_MODE_DCI)
                                            ? 0
                                            : src_params->dmsr_params.dmsr_enable;

    /* 0x0008(reg2) */
    dst_reg->common.reg2.sw_vdpp_working_mode = src_params->working_mode;
    VDPP2_DBG(VDPP2_DBG_TRACE, "working_mode %d", src_params->working_mode);

    /* 0x000C ~ 0x001C(reg3 ~ reg7), skip */
    dst_reg->common.reg4.sw_vdpp_clk_on = 1;
    dst_reg->common.reg4.sw_md_clk_on = 1;
    dst_reg->common.reg4.sw_dect_clk_on = 1;
    dst_reg->common.reg4.sw_me_clk_on = 1;
    dst_reg->common.reg4.sw_mc_clk_on = 1;
    dst_reg->common.reg4.sw_eedi_clk_on = 1;
    dst_reg->common.reg4.sw_ble_clk_on = 1;
    dst_reg->common.reg4.sw_out_clk_on = 1;
    dst_reg->common.reg4.sw_ctrl_clk_on = 1;
    dst_reg->common.reg4.sw_ram_clk_on = 1;
    dst_reg->common.reg4.sw_dma_clk_on = 1;
    dst_reg->common.reg4.sw_reg_clk_on = 1;

    /* 0x0020(reg8) */
    dst_reg->common.reg8.sw_vdpp_frm_done_en = 1;
    dst_reg->common.reg8.sw_vdpp_osd_max_en = 1;
    dst_reg->common.reg8.sw_vdpp_bus_error_en = 1;
    dst_reg->common.reg8.sw_vdpp_timeout_int_en = 1;
    dst_reg->common.reg8.sw_vdpp_config_error_en = 1;
    /* 0x0024 ~ 0x002C(reg9 ~ reg11), skip */
    {
        RK_U32 src_right_redundant = src_params->src_width % 16 == 0 ? 0 : 16 - src_params->src_width % 16;
        RK_U32 src_down_redundant  = src_params->src_height % 8 == 0 ? 0 : 8 - src_params->src_height % 8;
        RK_U32 dst_right_redundant = src_params->dst_width % 16 == 0 ? 0 : 16 - src_params->dst_width % 16;
        /* 0x0030(reg12) */
        dst_reg->common.reg12.sw_vdpp_src_vir_y_stride = src_params->src_width_vir / 4;

        /* 0x0034(reg13) */
        dst_reg->common.reg13.sw_vdpp_dst_vir_y_stride = src_params->dst_width_vir / 4;

        /* 0x0038(reg14) */
        dst_reg->common.reg14.sw_vdpp_src_pic_width = src_params->src_width + src_right_redundant - 1;
        dst_reg->common.reg14.sw_vdpp_src_right_redundant = src_right_redundant;
        dst_reg->common.reg14.sw_vdpp_src_pic_height = src_params->src_height + src_down_redundant - 1;
        dst_reg->common.reg14.sw_vdpp_src_down_redundant = src_down_redundant;

        /* 0x003C(reg15) */
        dst_reg->common.reg15.sw_vdpp_dst_pic_width = src_params->dst_width + dst_right_redundant - 1;
        dst_reg->common.reg15.sw_vdpp_dst_right_redundant = dst_right_redundant;
        dst_reg->common.reg15.sw_vdpp_dst_pic_height = src_params->dst_height - 1;
    }
    /* 0x0040 ~ 0x005C(reg16 ~ reg23), skip */
    dst_reg->common.reg20.sw_vdpp_timeout_en = 1;
    dst_reg->common.reg20.sw_vdpp_timeout_cnt = 0x8FFFFFF;

    /* 0x0060(reg24) */
    dst_reg->common.reg24.sw_vdpp_src_addr_y = src_params->src.y;

    /* 0x0064(reg25) */
    dst_reg->common.reg25.sw_vdpp_src_addr_uv = src_params->src.cbcr;

    /* 0x0068(reg26) */
    dst_reg->common.reg26.sw_vdpp_dst_addr_y = src_params->dst.y;

    /* 0x006C(reg27) */
    dst_reg->common.reg27.sw_vdpp_dst_addr_uv = src_params->dst.cbcr;

    if (src_params->yuv_out_diff) {
        RK_U32 dst_right_redundant_c = src_params->dst_c_width % 16 == 0 ? 0 : 16 - src_params->dst_c_width % 16;

        dst_reg->common.reg1.sw_vdpp_yuvout_diff_en = src_params->yuv_out_diff;
        dst_reg->common.reg13.sw_vdpp_dst_vir_c_stride = src_params->dst_c_width_vir / 4;
        /* 0x0040(reg16) */
        dst_reg->common.reg16.sw_vdpp_dst_pic_width_c = src_params->dst_c_width + dst_right_redundant_c - 1;
        dst_reg->common.reg16.sw_vdpp_dst_right_redundant_c = dst_right_redundant_c;
        dst_reg->common.reg16.sw_vdpp_dst_pic_height_c = src_params->dst_c_height - 1;

        dst_reg->common.reg27.sw_vdpp_dst_addr_uv = src_params->dst_c.cbcr;
    }

    set_dmsr_to_vdpp_reg(&src_params->dmsr_params, &ctx->dmsr);
    set_hist_to_vdpp2_reg(src_params, dst_reg);
    set_es_to_vdpp2_reg(src_params, dst_reg);
    set_shp_to_vdpp2_reg(src_params, dst_reg);

    zme_params->src_width = src_params->src_width;
    zme_params->src_height = src_params->src_height;
    zme_params->dst_width = src_params->dst_width;
    zme_params->dst_height = src_params->dst_height;
    zme_params->dst_fmt = src_params->dst_fmt;
    zme_params->yuv_out_diff = src_params->yuv_out_diff;
    zme_params->dst_c_width = src_params->dst_c_width;
    zme_params->dst_c_height = src_params->dst_c_height;
    set_zme_to_vdpp_reg(zme_params, &ctx->zme);

    return MPP_OK;
}